

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerRsaPssBadTrailer_Test::TestBody
          (SignatureAlgorithmTest_ParseDerRsaPssBadTrailer_Test *this)

{
  optional<bssl::SignatureAlgorithm> oVar1;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  Input algorithm_identifier;
  AssertionResult gtest_ar_;
  uint8_t kData [22];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  AssertHelper local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  string local_48;
  uchar local_28 [24];
  
  local_28[0] = '0';
  local_28[1] = '\x14';
  local_28[2] = '\x06';
  local_28[3] = '\t';
  local_28[4] = '*';
  local_28[5] = 0x86;
  local_28[6] = 'H';
  local_28[7] = 0x86;
  local_28[8] = 0xf7;
  local_28[9] = '\r';
  local_28[10] = '\x01';
  local_28[0xb] = '\x01';
  local_28[0xc] = '\n';
  local_28[0xd] = '0';
  local_28[0xe] = '\a';
  local_28[0xf] = 0xa3;
  local_28[0x10] = '\x05';
  local_28[0x11] = '\x02';
  local_28[0x12] = '\x01';
  local_28[0x13] = '\x01';
  local_28[0x14] = '\x05';
  local_28[0x15] = '\0';
  algorithm_identifier.data_.size_ = 0x16;
  algorithm_identifier.data_.data_ = local_28;
  oVar1 = ParseSignatureAlgorithm(algorithm_identifier);
  local_58[0] = (internal)
                (((ulong)oVar1.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload
                         .super__Optional_payload_base<bssl::SignatureAlgorithm> >> 0x20 & 1) == 0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_58[0]) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,local_58,(AssertionResult *)"ParseSignatureAlgorithm(der::Input(kData))",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
               ,0x289,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerRsaPssBadTrailer) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x14,  // SEQUENCE (20 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x0A,
      0x30, 0x07,  // SEQUENCE (7 bytes)
      0xA3, 0x05,  // [3] (5 bytes)
      0x02, 0x01,  // INTEGER (1 byte)
      0x01,
      0x05, 0x00,  // NULL (0 bytes)
  };
  // clang-format on
  EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(kData)));
}